

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjExporter.cpp
# Opt level: O2

void __thiscall
Assimp::ObjExporter::AddMesh(ObjExporter *this,aiString *name,aiMesh *m,aiMatrix4x4 *mat)

{
  pointer pFVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint uVar4;
  pointer pMVar5;
  aiFace *paVar6;
  aiColor4D *paVar7;
  char cVar8;
  int iVar9;
  ulong uVar10;
  uint a;
  ulong uVar11;
  long lVar12;
  vector<Assimp::ObjExporter::FaceVertex,_std::allocator<Assimp::ObjExporter::FaceVertex>_> *this_00
  ;
  aiVector3t<float> aVar13;
  aiVector3t<float> local_98;
  undefined1 local_88 [8];
  float local_80;
  ai_real aStack_7c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  _Alloc_hider local_68;
  size_type sStack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  pointer local_48;
  pointer pFStack_40;
  pointer local_38;
  
  sStack_60 = 0;
  local_58._8_8_ = 0;
  local_78._M_allocated_capacity._0_4_ = 0;
  local_78._M_allocated_capacity._4_4_ = 0.0;
  local_78._8_8_ = 0;
  local_80 = 0.0;
  aStack_7c = 0.0;
  local_68._M_p = (pointer)&local_58;
  local_58._M_allocated_capacity = 0;
  local_48 = (pointer)0x0;
  pFStack_40 = (pointer)0x0;
  local_38 = (pointer)0x0;
  local_88 = (undefined1  [8])&local_78;
  std::vector<Assimp::ObjExporter::MeshInstance,_std::allocator<Assimp::ObjExporter::MeshInstance>_>
  ::emplace_back<Assimp::ObjExporter::MeshInstance>(&this->mMeshes,(MeshInstance *)local_88);
  MeshInstance::~MeshInstance((MeshInstance *)local_88);
  pMVar5 = (this->mMeshes).
           super__Vector_base<Assimp::ObjExporter::MeshInstance,_std::allocator<Assimp::ObjExporter::MeshInstance>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (m->mColors[0] != (aiColor4D *)0x0) {
    this->useVc = true;
  }
  local_88 = (undefined1  [8])&local_78;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_88,name->data,name->data + name->length);
  std::__cxx11::string::operator=((string *)(pMVar5 + -1),(string *)local_88);
  std::__cxx11::string::~string((string *)local_88);
  GetMaterialName_abi_cxx11_((string *)local_88,this,m->mMaterialIndex);
  std::__cxx11::string::operator=((string *)&pMVar5[-1].matname,(string *)local_88);
  std::__cxx11::string::~string((string *)local_88);
  std::vector<Assimp::ObjExporter::Face,_std::allocator<Assimp::ObjExporter::Face>_>::resize
            (&pMVar5[-1].faces,(ulong)m->mNumFaces);
  for (uVar10 = 0; uVar10 < m->mNumFaces; uVar10 = uVar10 + 1) {
    paVar6 = m->mFaces;
    cVar8 = 'f';
    if (paVar6[uVar10].mNumIndices == 2) {
      cVar8 = 'l';
    }
    if (paVar6[uVar10].mNumIndices == 1) {
      cVar8 = 'p';
    }
    pFVar1 = pMVar5[-1].faces.
             super__Vector_base<Assimp::ObjExporter::Face,_std::allocator<Assimp::ObjExporter::Face>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar10;
    this_00 = &pFVar1->indices;
    pFVar1->kind = cVar8;
    std::vector<Assimp::ObjExporter::FaceVertex,_std::allocator<Assimp::ObjExporter::FaceVertex>_>::
    resize(this_00,(ulong)paVar6[uVar10].mNumIndices);
    lVar12 = 0;
    for (uVar11 = 0; uVar11 < paVar6[uVar10].mNumIndices; uVar11 = uVar11 + 1) {
      uVar4 = paVar6[uVar10].mIndices[uVar11];
      aVar13 = ::operator*(mat,m->mVertices + uVar4);
      local_80 = aVar13.z;
      paVar7 = m->mColors[0];
      local_88 = aVar13._0_8_;
      if (paVar7 == (aiColor4D *)0x0) {
        aStack_7c = 0.0;
        local_78._M_allocated_capacity._0_4_ = 0;
        local_78._M_allocated_capacity._4_4_ = 0.0;
      }
      else {
        local_78._M_allocated_capacity._4_4_ = paVar7[uVar4].b;
        uVar2 = paVar7[uVar4].r;
        uVar3 = paVar7[uVar4].g;
        aStack_7c = (ai_real)uVar2;
        local_78._M_allocated_capacity._0_4_ = uVar3;
      }
      iVar9 = indexMap<Assimp::ObjExporter::vertexData,_Assimp::ObjExporter::vertexDataCompare>::
              getIndex(&this->mVpMap,(vertexData *)local_88);
      *(int *)((long)&((this_00->
                       super__Vector_base<Assimp::ObjExporter::FaceVertex,_std::allocator<Assimp::ObjExporter::FaceVertex>_>
                       )._M_impl.super__Vector_impl_data._M_start)->vp + lVar12) = iVar9;
      if (m->mNormals == (aiVector3D *)0x0) {
        *(undefined4 *)
         ((long)&((this_00->
                  super__Vector_base<Assimp::ObjExporter::FaceVertex,_std::allocator<Assimp::ObjExporter::FaceVertex>_>
                  )._M_impl.super__Vector_impl_data._M_start)->vn + lVar12) = 0;
      }
      else {
        aiMatrix3x3t<float>::aiMatrix3x3t((aiMatrix3x3t<float> *)local_88,mat);
        aVar13 = ::operator*((aiMatrix3x3t<float> *)local_88,m->mNormals + uVar4);
        local_98.z = aVar13.z;
        local_98._0_8_ = aVar13._0_8_;
        iVar9 = indexMap<aiVector3t<float>,_Assimp::ObjExporter::aiVectorCompare>::getIndex
                          (&this->mVnMap,&local_98);
        *(int *)((long)&((this_00->
                         super__Vector_base<Assimp::ObjExporter::FaceVertex,_std::allocator<Assimp::ObjExporter::FaceVertex>_>
                         )._M_impl.super__Vector_impl_data._M_start)->vn + lVar12) = iVar9;
      }
      if (m->mTextureCoords[0] == (aiVector3D *)0x0) {
        iVar9 = 0;
      }
      else {
        iVar9 = indexMap<aiVector3t<float>,_Assimp::ObjExporter::aiVectorCompare>::getIndex
                          (&this->mVtMap,m->mTextureCoords[0] + uVar4);
      }
      *(int *)((long)&((this_00->
                       super__Vector_base<Assimp::ObjExporter::FaceVertex,_std::allocator<Assimp::ObjExporter::FaceVertex>_>
                       )._M_impl.super__Vector_impl_data._M_start)->vt + lVar12) = iVar9;
      lVar12 = lVar12 + 0xc;
    }
  }
  return;
}

Assistant:

void ObjExporter::AddMesh(const aiString& name, const aiMesh* m, const aiMatrix4x4& mat) {
    mMeshes.push_back(MeshInstance() );
    MeshInstance& mesh = mMeshes.back();

    if ( nullptr != m->mColors[ 0 ] ) {
        useVc = true;
    }

    mesh.name = std::string( name.data, name.length );
    mesh.matname = GetMaterialName(m->mMaterialIndex);

    mesh.faces.resize(m->mNumFaces);

    for(unsigned int i = 0; i < m->mNumFaces; ++i) {
        const aiFace& f = m->mFaces[i];

        Face& face = mesh.faces[i];
        switch (f.mNumIndices) {
            case 1:
                face.kind = 'p';
                break;
            case 2:
                face.kind = 'l';
                break;
            default:
                face.kind = 'f';
        }
        face.indices.resize(f.mNumIndices);

        for(unsigned int a = 0; a < f.mNumIndices; ++a) {
            const unsigned int idx = f.mIndices[a];

            aiVector3D vert = mat * m->mVertices[idx];

            if ( nullptr != m->mColors[ 0 ] ) {
                aiColor4D col4 = m->mColors[ 0 ][ idx ];
                face.indices[a].vp = mVpMap.getIndex({vert, aiColor3D(col4.r, col4.g, col4.b)});
            } else {
                face.indices[a].vp = mVpMap.getIndex({vert, aiColor3D(0,0,0)});
            }

            if (m->mNormals) {
                aiVector3D norm = aiMatrix3x3(mat) * m->mNormals[idx];
                face.indices[a].vn = mVnMap.getIndex(norm);
            } else {
                face.indices[a].vn = 0;
            }

            if ( m->mTextureCoords[ 0 ] ) {
                face.indices[a].vt = mVtMap.getIndex(m->mTextureCoords[0][idx]);
            } else {
                face.indices[a].vt = 0;
            }
        }
    }
}